

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AvoidReinterprets.cpp
# Opt level: O0

Pass * wasm::createAvoidReinterpretsPass(void)

{
  AvoidReinterprets *this;
  
  this = (AvoidReinterprets *)operator_new(0x140);
  memset(this,0,0x140);
  AvoidReinterprets::AvoidReinterprets(this);
  return (Pass *)this;
}

Assistant:

Pass* createAvoidReinterpretsPass() { return new AvoidReinterprets(); }